

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

void SetErrorMessage(ScriptContext *scriptContext,JavascriptError *newError,JsValueRef message)

{
  bool bVar1;
  BOOL BVar2;
  undefined1 local_58 [8];
  PropertyDescriptor desc;
  JavascriptString *messageStr;
  JsValueRef message_local;
  JavascriptError *newError_local;
  ScriptContext *scriptContext_local;
  
  BVar2 = Js::JavascriptOperators::IsUndefined(message);
  if (BVar2 == 0) {
    desc.Configurable = false;
    desc.fromProxy = false;
    desc._42_6_ = 0;
    bVar1 = Js::VarIs<Js::JavascriptString>(message);
    if (bVar1) {
      desc._40_8_ = Js::VarTo<Js::JavascriptString>(message);
    }
    else {
      desc._40_8_ = Js::JavascriptConversion::ToString(message,scriptContext);
    }
    Js::PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_58);
    Js::PropertyDescriptor::SetValue((PropertyDescriptor *)local_58,(Var)desc._40_8_);
    Js::PropertyDescriptor::SetWritable((PropertyDescriptor *)local_58,true);
    Js::PropertyDescriptor::SetEnumerable((PropertyDescriptor *)local_58,false);
    Js::PropertyDescriptor::SetConfigurable((PropertyDescriptor *)local_58,true);
    Js::JavascriptOperators::SetPropertyDescriptor
              ((RecyclableObject *)newError,0x102,(PropertyDescriptor *)local_58);
  }
  return;
}

Assistant:

void SetErrorMessage(Js::ScriptContext *scriptContext, Js::JavascriptError *newError, JsValueRef message)
{
    // ECMA262 #sec-error-message
    if (!Js::JavascriptOperators::IsUndefined(message))
    {
        Js::JavascriptString *messageStr = nullptr;
        if (Js::VarIs<Js::JavascriptString>(message))
        {
            messageStr = Js::VarTo<Js::JavascriptString>(message);
        }
        else
        {
            messageStr = Js::JavascriptConversion::ToString(message, scriptContext);
        }

        Js::PropertyDescriptor desc;
        desc.SetValue(messageStr);
        desc.SetWritable(true);
        desc.SetEnumerable(false);
        desc.SetConfigurable(true);
        Js::JavascriptOperators::SetPropertyDescriptor(newError, Js::PropertyIds::message, desc);
    }
}